

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_spawn.cpp
# Opt level: O0

void test6(void)

{
  ostream *poVar1;
  int i_1;
  char *in_stack_00000010;
  int i;
  int *in_stack_00000020;
  int *in_stack_00000028;
  _func_void_int_int_ptr *in_stack_00000030;
  int local_24;
  int local_c;
  
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::spawn<void(int,int&),int&,int&>(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  for (local_c = 1; local_c < nsize; local_c = local_c + 1) {
    depspawn::spawn<void(int,int&),int&,int&>(in_stack_00000030,in_stack_00000028,in_stack_00000020)
    ;
  }
  t1.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::wait_for_all();
  t2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  for (local_24 = 0; local_24 < nsize; local_24 = local_24 + 1) {
    if (mx[local_24][0] != local_24 + 1) {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_24);
      poVar1 = std::operator<<(poVar1," -> ");
      std::ostream::operator<<(poVar1,mx[local_24][0]);
      doerror();
    }
    mx[local_24][0] = 0;
  }
  pr(in_stack_00000010);
  return;
}

Assistant:

void test6() 
{
  
  t0 = std::chrono::high_resolution_clock::now();
  
  spawn(depprev, mx[0][0], mx[0][0]);
  
  for(int i = 1; i < nsize; i++) {
    spawn(depprev, mx[i-1][0], mx[i][0]);
  }
  
  t1 = std::chrono::high_resolution_clock::now();
  
  wait_for_all();
  
  t2 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    if(mx[i][0] != (i+1)) {
      std::cerr << i << " -> " << mx[i][0];
      doerror();
    }
    mx[i][0] = 0;
  }
  
  pr("f(int, int&) dep->");
  
}